

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::applyScaling(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp)

{
  undefined8 *puVar1;
  uint *puVar2;
  uint uVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  pointer pnVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  long lVar11;
  cpp_dec_float<50U,_int,_void> local_288;
  long local_250;
  undefined4 local_248;
  uint uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  double local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined4 local_200;
  undefined1 local_1fc;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  int local_180;
  undefined1 local_17c;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  int local_100;
  undefined1 local_fc;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  if (0 < (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    pdVar8 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_238 = *pdVar8;
    local_248 = SUB84(local_238,0);
    uStack_230 = 0;
    uStack_244 = (uint)((ulong)local_238 >> 0x20) ^ 0x80000000;
    uStack_240 = 0;
    uStack_23c = 0x80000000;
    lVar9 = 0;
    do {
      pIVar4 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar7 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar9].idx;
      uVar3 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).scaleExp.data[lVar9];
      local_250 = lVar9;
      if (0 < pIVar4[iVar7].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar4 = pIVar4 + iVar7;
        lVar9 = 0;
        lVar11 = 0;
        do {
          pNVar5 = (pIVar4->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          local_1c8 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x20);
          puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9);
          local_1e8 = *puVar1;
          uStack_1e0 = puVar1[1];
          puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x10);
          local_1d8 = *puVar1;
          uStack_1d0 = puVar1[1];
          local_1c0 = *(undefined4 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x28);
          local_1bc = *(undefined1 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x2c);
          local_1b8 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x30);
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_288,(soplex *)&local_1e8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)((lp->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).scaleExp.data
                                [*(int *)((long)(&((pIVar4->data).
                                                                                                      
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar9)] + uVar3),
                     CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
          pNVar5 = (pIVar4->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          *(ulong *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x20) =
               CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
          puVar2 = (uint *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x10);
          *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
          puVar2 = (uint *)((long)&(pNVar5->val).m_backend.data + lVar9);
          *(undefined8 *)puVar2 = local_288.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_288.data._M_elems._8_8_;
          *(int *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x28) = local_288.exp;
          *(bool *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x2c) = local_288.neg;
          *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x30) = local_288._48_8_;
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 0x3c;
        } while (lVar11 < (pIVar4->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      lVar9 = local_250;
      pnVar6 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = *(undefined8 *)((long)&pnVar6[local_250].m_backend.data + 0x20);
      local_68 = *(undefined8 *)&pnVar6[local_250].m_backend.data;
      uStack_60 = *(undefined8 *)((long)&pnVar6[local_250].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar6[local_250].m_backend.data + 0x10);
      local_58 = *(undefined8 *)puVar2;
      uStack_50 = *(undefined8 *)(puVar2 + 2);
      local_40 = pnVar6[local_250].m_backend.exp;
      local_3c = pnVar6[local_250].m_backend.neg;
      local_38._0_4_ = pnVar6[local_250].m_backend.fpclass;
      local_38._4_4_ = pnVar6[local_250].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_288,(soplex *)&local_68,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)uVar3,CONCAT31((int3)((uint)local_40 >> 8),local_3c));
      pnVar6 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar6[lVar9].m_backend.data + 0x20) =
           CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
      puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
      *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
      *(ulong *)(puVar2 + 2) =
           CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
      *(undefined8 *)&pnVar6[lVar9].m_backend.data = local_288.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8) = local_288.data._M_elems._8_8_;
      pnVar6[lVar9].m_backend.exp = local_288.exp;
      pnVar6[lVar9].m_backend.neg = local_288.neg;
      pnVar6[lVar9].m_backend.fpclass = local_288.fpclass;
      pnVar6[lVar9].m_backend.prec_elem = local_288.prec_elem;
      pcVar10 = &(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend;
      ::soplex::infinity::__tls_init();
      local_288.fpclass = cpp_dec_float_finite;
      local_288.prec_elem = 10;
      local_288.data._M_elems[0] = 0;
      local_288.data._M_elems[1] = 0;
      local_288.data._M_elems[2] = 0;
      local_288.data._M_elems[3] = 0;
      local_288.data._M_elems[4] = 0;
      local_288.data._M_elems[5] = 0;
      local_288.data._M_elems._24_5_ = 0;
      local_288.data._M_elems[7]._1_3_ = 0;
      local_288.data._M_elems._32_5_ = 0;
      local_288.data._M_elems[9]._1_3_ = 0;
      local_288.exp = 0;
      local_288.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_288,local_238);
      if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_288.fpclass != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar10,&local_288), iVar7 < 0)) {
        pnVar6 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_88 = *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 0x20);
        local_a8 = *(undefined8 *)&pnVar6[lVar9].m_backend.data;
        uStack_a0 = *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
        local_98 = *(undefined8 *)puVar2;
        uStack_90 = *(undefined8 *)(puVar2 + 2);
        local_80 = pnVar6[lVar9].m_backend.exp;
        local_7c = pnVar6[lVar9].m_backend.neg;
        local_78._0_4_ = pnVar6[lVar9].m_backend.fpclass;
        local_78._4_4_ = pnVar6[lVar9].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_288,(soplex *)&local_a8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)uVar3,CONCAT31((int3)((uint)local_80 >> 8),local_7c));
        pnVar6 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar6[lVar9].m_backend.data + 0x20) =
             CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
        *(undefined8 *)&pnVar6[lVar9].m_backend.data = local_288.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8) = local_288.data._M_elems._8_8_;
        pnVar6[lVar9].m_backend.exp = local_288.exp;
        pnVar6[lVar9].m_backend.neg = local_288.neg;
        pnVar6[lVar9].m_backend.fpclass = local_288.fpclass;
        pnVar6[lVar9].m_backend.prec_elem = local_288.prec_elem;
      }
      pcVar10 = &(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend;
      ::soplex::infinity::__tls_init();
      local_288.fpclass = cpp_dec_float_finite;
      local_288.prec_elem = 10;
      local_288.data._M_elems[0] = 0;
      local_288.data._M_elems[1] = 0;
      local_288.data._M_elems[2] = 0;
      local_288.data._M_elems[3] = 0;
      local_288.data._M_elems[4] = 0;
      local_288.data._M_elems[5] = 0;
      local_288.data._M_elems._24_5_ = 0;
      local_288.data._M_elems[7]._1_3_ = 0;
      local_288.data._M_elems._32_5_ = 0;
      local_288.data._M_elems[9]._1_3_ = 0;
      local_288.exp = 0;
      local_288.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_288,(double)CONCAT44(uStack_244,local_248));
      if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_288.fpclass != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar10,&local_288), 0 < iVar7)) {
        pnVar6 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_c8 = *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 0x20);
        local_e8 = *(undefined8 *)&pnVar6[lVar9].m_backend.data;
        uStack_e0 = *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
        local_d8 = *(undefined8 *)puVar2;
        uStack_d0 = *(undefined8 *)(puVar2 + 2);
        local_c0 = pnVar6[lVar9].m_backend.exp;
        local_bc = pnVar6[lVar9].m_backend.neg;
        local_b8._0_4_ = pnVar6[lVar9].m_backend.fpclass;
        local_b8._4_4_ = pnVar6[lVar9].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_288,(soplex *)&local_e8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)uVar3,CONCAT31((int3)((uint)local_c0 >> 8),local_bc));
        pnVar6 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar6[lVar9].m_backend.data + 0x20) =
             CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
        *(undefined8 *)&pnVar6[lVar9].m_backend.data = local_288.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8) = local_288.data._M_elems._8_8_;
        pnVar6[lVar9].m_backend.exp = local_288.exp;
        pnVar6[lVar9].m_backend.neg = local_288.neg;
        pnVar6[lVar9].m_backend.fpclass = local_288.fpclass;
        pnVar6[lVar9].m_backend.prec_elem = local_288.prec_elem;
      }
      lVar9 = local_250 + 1;
    } while (lVar9 < (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  if (0 < (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    pdVar8 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_238 = *pdVar8;
    local_248 = SUB84(local_238,0);
    uStack_230 = 0;
    uStack_244 = (uint)((ulong)local_238 >> 0x20) ^ 0x80000000;
    uStack_240 = 0;
    uStack_23c = 0x80000000;
    local_250 = 0;
    do {
      pIVar4 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar7 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[local_250].idx;
      uVar3 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).scaleExp.data[local_250];
      if (0 < pIVar4[iVar7].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar4 = pIVar4 + iVar7;
        lVar9 = 0;
        lVar11 = 0;
        do {
          pNVar5 = (pIVar4->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          local_208 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x20);
          puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9);
          local_228 = *puVar1;
          uStack_220 = puVar1[1];
          puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x10);
          local_218 = *puVar1;
          uStack_210 = puVar1[1];
          local_200 = *(undefined4 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x28);
          local_1fc = *(undefined1 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x2c);
          local_1f8 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x30);
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_288,(soplex *)&local_228,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)((lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).scaleExp.data
                                [*(int *)((long)(&((pIVar4->data).
                                                                                                      
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar9)] + uVar3),
                     CONCAT31((int3)((uint)local_200 >> 8),local_1fc));
          pNVar5 = (pIVar4->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          *(ulong *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x20) =
               CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
          puVar2 = (uint *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x10);
          *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
          puVar2 = (uint *)((long)&(pNVar5->val).m_backend.data + lVar9);
          *(undefined8 *)puVar2 = local_288.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_288.data._M_elems._8_8_;
          *(int *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x28) = local_288.exp;
          *(bool *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x2c) = local_288.neg;
          *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar9 + 0x30) = local_288._48_8_;
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 0x3c;
        } while (lVar11 < (pIVar4->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      lVar9 = local_250;
      pnVar6 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_108 = *(undefined8 *)((long)&pnVar6[local_250].m_backend.data + 0x20);
      local_128 = *(undefined8 *)&pnVar6[local_250].m_backend.data;
      uStack_120 = *(undefined8 *)((long)&pnVar6[local_250].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar6[local_250].m_backend.data + 0x10);
      local_118 = *(undefined8 *)puVar2;
      uStack_110 = *(undefined8 *)(puVar2 + 2);
      local_100 = pnVar6[local_250].m_backend.exp;
      local_fc = pnVar6[local_250].m_backend.neg;
      local_f8._0_4_ = pnVar6[local_250].m_backend.fpclass;
      local_f8._4_4_ = pnVar6[local_250].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_288,(soplex *)&local_128,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)uVar3,CONCAT31((int3)((uint)local_100 >> 8),local_fc));
      pnVar6 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar6[lVar9].m_backend.data + 0x20) =
           CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
      puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
      *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
      *(ulong *)(puVar2 + 2) =
           CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
      *(undefined8 *)&pnVar6[lVar9].m_backend.data = local_288.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8) = local_288.data._M_elems._8_8_;
      pnVar6[lVar9].m_backend.exp = local_288.exp;
      pnVar6[lVar9].m_backend.neg = local_288.neg;
      pnVar6[lVar9].m_backend.fpclass = local_288.fpclass;
      pnVar6[lVar9].m_backend.prec_elem = local_288.prec_elem;
      pcVar10 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend;
      ::soplex::infinity::__tls_init();
      local_288.fpclass = cpp_dec_float_finite;
      local_288.prec_elem = 10;
      local_288.data._M_elems[0] = 0;
      local_288.data._M_elems[1] = 0;
      local_288.data._M_elems[2] = 0;
      local_288.data._M_elems[3] = 0;
      local_288.data._M_elems[4] = 0;
      local_288.data._M_elems[5] = 0;
      local_288.data._M_elems._24_5_ = 0;
      local_288.data._M_elems[7]._1_3_ = 0;
      local_288.data._M_elems._32_5_ = 0;
      local_288.data._M_elems[9]._1_3_ = 0;
      local_288.exp = 0;
      local_288.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_288,local_238);
      if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_288.fpclass != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar10,&local_288), iVar7 < 0)) {
        pnVar6 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_148 = *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 0x20);
        local_168 = *(undefined8 *)&pnVar6[lVar9].m_backend.data;
        uStack_160 = *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
        local_158 = *(undefined8 *)puVar2;
        uStack_150 = *(undefined8 *)(puVar2 + 2);
        local_140 = pnVar6[lVar9].m_backend.exp;
        local_13c = pnVar6[lVar9].m_backend.neg;
        local_138._0_4_ = pnVar6[lVar9].m_backend.fpclass;
        local_138._4_4_ = pnVar6[lVar9].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_288,(soplex *)&local_168,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)-uVar3,CONCAT31((int3)((uint)local_140 >> 8),local_13c));
        pnVar6 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar6[lVar9].m_backend.data + 0x20) =
             CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
        *(undefined8 *)&pnVar6[lVar9].m_backend.data = local_288.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8) = local_288.data._M_elems._8_8_;
        pnVar6[lVar9].m_backend.exp = local_288.exp;
        pnVar6[lVar9].m_backend.neg = local_288.neg;
        pnVar6[lVar9].m_backend.fpclass = local_288.fpclass;
        pnVar6[lVar9].m_backend.prec_elem = local_288.prec_elem;
      }
      pcVar10 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend;
      ::soplex::infinity::__tls_init();
      local_288.fpclass = cpp_dec_float_finite;
      local_288.prec_elem = 10;
      local_288.data._M_elems[0] = 0;
      local_288.data._M_elems[1] = 0;
      local_288.data._M_elems[2] = 0;
      local_288.data._M_elems[3] = 0;
      local_288.data._M_elems[4] = 0;
      local_288.data._M_elems[5] = 0;
      local_288.data._M_elems._24_5_ = 0;
      local_288.data._M_elems[7]._1_3_ = 0;
      local_288.data._M_elems._32_5_ = 0;
      local_288.data._M_elems[9]._1_3_ = 0;
      local_288.exp = 0;
      local_288.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_288,(double)CONCAT44(uStack_244,local_248));
      if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_288.fpclass != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar10,&local_288), 0 < iVar7)) {
        pnVar6 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_188 = *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 0x20);
        local_1a8 = *(undefined8 *)&pnVar6[lVar9].m_backend.data;
        uStack_1a0 = *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
        local_198 = *(undefined8 *)puVar2;
        uStack_190 = *(undefined8 *)(puVar2 + 2);
        local_180 = pnVar6[lVar9].m_backend.exp;
        local_17c = pnVar6[lVar9].m_backend.neg;
        local_178._0_4_ = pnVar6[lVar9].m_backend.fpclass;
        local_178._4_4_ = pnVar6[lVar9].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_288,(soplex *)&local_1a8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)-uVar3,CONCAT31((int3)((uint)local_180 >> 8),local_17c));
        pnVar6 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar6[lVar9].m_backend.data + 0x20) =
             CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&pnVar6[lVar9].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
        *(undefined8 *)&pnVar6[lVar9].m_backend.data = local_288.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar6[lVar9].m_backend.data + 8) = local_288.data._M_elems._8_8_;
        pnVar6[lVar9].m_backend.exp = local_288.exp;
        pnVar6[lVar9].m_backend.neg = local_288.neg;
        pnVar6[lVar9].m_backend.fpclass = local_288.fpclass;
        pnVar6[lVar9].m_backend.prec_elem = local_288.prec_elem;
      }
      local_250 = local_250 + 1;
    } while (local_250 <
             (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  }
  lp->_isScaled = true;
  return;
}

Assistant:

void SPxScaler<R>::applyScaling(SPxLPBase<R>& lp)
{
   assert(lp.nCols() == m_activeColscaleExp->size());
   assert(lp.nRows() == m_activeRowscaleExp->size());

   DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      SVectorBase<R>& vec = lp.rowVector_w(i);
      int exp1;
      int exp2 = rowscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = colscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxRowObj_w(i) = spxLdexp(lp.maxRowObj(i), exp2);

      if(lp.rhs(i) < R(infinity))
         lp.rhs_w(i) = spxLdexp(lp.rhs_w(i), exp2);

      if(lp.lhs(i) > R(-infinity))
         lp.lhs_w(i) = spxLdexp(lp.lhs_w(i), exp2);

      SPxOut::debug(this, "DEBUG: rowscaleExp({}): {}\n", i, exp2);
   }

   for(int i = 0; i < lp.nCols(); ++i)
   {
      SVectorBase<R>& vec = lp.colVector_w(i);
      int exp1;
      int exp2 = colscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = rowscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxObj_w(i) = spxLdexp(lp.maxObj_w(i), exp2);

      if(lp.upper(i) < R(infinity))
         lp.upper_w(i) = spxLdexp(lp.upper_w(i), -exp2);

      if(lp.lower(i) > R(-infinity))
         lp.lower_w(i) = spxLdexp(lp.lower_w(i), -exp2);

      SPxOut::debug(this, "DEBUG: colscaleExp({}): {}\n", i, exp2);
   }

   lp.setScalingInfo(true);
   assert(lp.isConsistent());
}